

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void anon_unknown.dwarf_998c::merge_two<big_integer>
               (vector<big_integer,_std::allocator<big_integer>_> *v)

{
  undefined1 success;
  bool bVar1;
  size_type sVar2;
  vector<big_integer,_std::allocator<big_integer>_> *in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  big_integer ab;
  big_integer b;
  big_integer a;
  big_integer *in_stack_fffffffffffffda0;
  value_type *in_stack_fffffffffffffda8;
  big_integer *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  big_integer *in_stack_fffffffffffffdc0;
  Type in_stack_fffffffffffffdcc;
  AssertHelper *in_stack_fffffffffffffdd0;
  vector<big_integer,_std::allocator<big_integer>_> *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  AssertionResult *in_stack_fffffffffffffe18;
  AssertHelper *in_stack_fffffffffffffe20;
  AssertionResult local_1c0;
  uint local_1ac;
  string local_1a8 [160];
  AssertionResult local_108 [16];
  
  sVar2 = std::vector<big_integer,_std::allocator<big_integer>_>::size(in_RDI);
  if (sVar2 < 2) {
    __assert_fail("v.size() >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
                  ,0x29f,"void (anonymous namespace)::merge_two(std::vector<T> &) [T = big_integer]"
                 );
  }
  extract_random_element<big_integer>(in_stack_fffffffffffffde8);
  extract_random_element<big_integer>(in_stack_fffffffffffffde8);
  big_integer::big_integer
            (in_stack_fffffffffffffdc0,
             (big_integer *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  ::operator*((big_integer *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
              in_stack_fffffffffffffdb0);
  big_integer::~big_integer(in_stack_fffffffffffffda0);
  big_integer::big_integer
            (in_stack_fffffffffffffdc0,
             (big_integer *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  operator/((big_integer *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
            in_stack_fffffffffffffdb0);
  success = operator==((big_integer *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                       in_stack_fffffffffffffdb0);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffffda0,(bool)success);
  big_integer::~big_integer(in_stack_fffffffffffffda0);
  big_integer::~big_integer(in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               in_stack_fffffffffffffe00);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,&in_stack_fffffffffffffdc0->sign,
               in_stack_fffffffffffffdbc,&in_stack_fffffffffffffdb0->sign);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe20,(Message *)in_stack_fffffffffffffe18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffda0);
    std::__cxx11::string::~string(local_1a8);
    testing::Message::~Message((Message *)0x125474);
  }
  local_1ac = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x125521);
  if (local_1ac == 0) {
    big_integer::big_integer
              (in_stack_fffffffffffffdc0,
               (big_integer *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    operator/((big_integer *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
              in_stack_fffffffffffffdb0);
    operator==((big_integer *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
               in_stack_fffffffffffffdb0);
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_fffffffffffffda0,(bool)success);
    big_integer::~big_integer(in_stack_fffffffffffffda0);
    big_integer::~big_integer(in_stack_fffffffffffffda0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffdd0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,
                 &in_stack_fffffffffffffdc0->sign,in_stack_fffffffffffffdbc,
                 &in_stack_fffffffffffffdb0->sign);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe20,(Message *)in_stack_fffffffffffffe18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffda0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffda0);
      testing::Message::~Message((Message *)0x12569f);
    }
    local_1ac = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x125740);
    if (local_1ac == 0) {
      std::vector<big_integer,_std::allocator<big_integer>_>::push_back
                ((vector<big_integer,_std::allocator<big_integer>_> *)in_stack_fffffffffffffdb0,
                 in_stack_fffffffffffffda8);
      local_1ac = 0;
    }
  }
  big_integer::~big_integer(in_stack_fffffffffffffda0);
  big_integer::~big_integer(in_stack_fffffffffffffda0);
  big_integer::~big_integer(in_stack_fffffffffffffda0);
  return;
}

Assistant:

void merge_two(std::vector<T>& v)
    {
        assert(v.size() >= 2);

        T a = extract_random_element(v);
        T b = extract_random_element(v);

        T ab = a * b;
        ASSERT_TRUE(ab / a == b);
        ASSERT_TRUE(ab / b == a);

        v.push_back(ab);
    }